

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O2

void __thiscall rsg::VariableType::Member::Member(Member *this,Member *other)

{
  VariableType *other_00;
  VariableType *this_00;
  
  this->m_type = (VariableType *)0x0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)&other->m_name);
  other_00 = other->m_type;
  if (other_00 != (VariableType *)0x0) {
    this_00 = (VariableType *)operator_new(0x50);
    VariableType(this_00,other_00);
    this->m_type = this_00;
  }
  return;
}

Assistant:

Member (const Member& other)
			: m_type(DE_NULL)
			, m_name(other.m_name)
		{
			if (other.m_type)
				m_type = new VariableType(*other.m_type);
		}